

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other_functions.h
# Opt level: O3

void findAndMarkSuccessor(args *t,stateRecord *state)

{
  node *node;
  __int_type _Var1;
  __pointer_type pnVar2;
  
  node = (state->targetEdge).child;
  do {
    do {
      _Var1 = (node->markedKey).super___atomic_base<unsigned_long>._M_i;
      findSmallest(t,node,&state->successorRecord);
      if ((int)_Var1 < 0) goto LAB_00102944;
      t = (args *)(state->successorRecord).lastEdge.child;
      pnVar2 = (((atomic<node_*> *)&t->newNode)->_M_b)._M_p;
    } while (((ulong)pnVar2 & 8) == 0);
    if (-1 < (int)(node->markedKey).super___atomic_base<unsigned_long>._M_i) {
      CAS((node *)t,0,(node *)((ulong)pnVar2 & 0xfffffffffffffff8),(node *)((ulong)node | 9));
    }
  } while (((ulong)pnVar2 & 1) == 0);
LAB_00102944:
  updateMode(t,state);
  return;
}

Assistant:

void findAndMarkSuccessor(struct args* t, struct stateRecord* state)
{
    struct node* node;
    struct seekRecord* s;
    struct edge successorEdge;
    bool m,n,d,p,result;
    struct node* temp;
    struct node* left;

    node = state->targetEdge.child;
    s = &state->successorRecord;

    while(true)
    {
        m=KeyMarked(node->markedKey);
        findSmallest(t,node,s);
        if(m)
        {
            break;
        }
        successorEdge = s->lastEdge;
        temp = successorEdge.child->child[LC];
        n=isNull(temp);
        p=PFlagSet(temp);
        left=getAddress(temp);
        if(!n)
        {
            continue;
        }
        m=KeyMarked(node->markedKey);
        if(m)
        {
            if(p)
            {
                break;
            }
            else
            {
                continue;
            }
        }
        result = CAS(successorEdge.child,LC,setNull(left),setPFlag(setNull(node)));
        if(result)
        {
            break;
        }
        temp = successorEdge.child->child[LC];
        n = isNull(temp);
        d = DFlagSet(temp);
        p = PFlagSet(temp);

        if(p)
        {
            break;
        }
        if(!n)
        {
            continue;
        }
        if(d)
        {
            helpTargetNode(t,&s->lastEdge,state->depth+1);
        }
    }
    updateMode(t,state);
    return;
}